

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

void __thiscall slang::SVInt::set(SVInt *this,int32_t msb,int32_t lsb,SVInt *value)

{
  bool bVar1;
  bitwidth_t bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  ulong __n;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 __s;
  uint64_t *puVar6;
  uint32_t *puVar7;
  uint64_t *puVar8;
  int local_58;
  uint32_t local_54;
  int local_44 [3];
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_38;
  uint64_t *newData;
  uint32_t validSelectWidth;
  uint32_t backOOB;
  uint32_t frontOOB;
  bitwidth_t selectWidth;
  SVInt *value_local;
  int32_t lsb_local;
  int32_t msb_local;
  SVInt *this_local;
  
  _frontOOB = value;
  value_local._0_4_ = lsb;
  value_local._4_4_ = msb;
  _lsb_local = this;
  if (msb < lsb) {
    assert::assertFailed
              ("msb >= lsb",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/numeric/SVInt.cpp"
               ,0x5db,"void slang::SVInt::set(int32_t, int32_t, const SVInt &)");
  }
  backOOB = (msb - lsb) + 1;
  bVar2 = getBitWidth(value);
  if (bVar2 == backOOB) {
    if ((-1 < (int)value_local._4_4_) &&
       ((int32_t)value_local < (int)(this->super_SVIntStorage).bitWidth)) {
      if ((int32_t)value_local < 0) {
        local_54 = -(int32_t)value_local;
      }
      else {
        local_54 = 0;
      }
      validSelectWidth = local_54;
      if (value_local._4_4_ < (this->super_SVIntStorage).bitWidth) {
        local_58 = 0;
      }
      else {
        local_58 = (value_local._4_4_ - (this->super_SVIntStorage).bitWidth) + 1;
      }
      newData._4_4_ = local_58;
      newData._0_4_ = (backOOB - local_54) - local_58;
      bVar1 = hasUnknown(this);
      if ((!bVar1) && (bVar1 = hasUnknown(_frontOOB), bVar1)) {
        uVar5 = getNumWords((this->super_SVIntStorage).bitWidth,true);
        __n = SUB168(ZEXT416(uVar5) * ZEXT816(8),0);
        if (SUB168(ZEXT416(uVar5) * ZEXT816(8),8) != 0) {
          __n = 0xffffffffffffffff;
        }
        __s.pVal = (uint64_t *)operator_new__(__n);
        memset(__s.pVal,0,__n);
        local_38.pVal = __s.pVal;
        puVar6 = getRawData(this);
        uVar5 = getNumWords(this);
        memcpy(__s.pVal,puVar6,(ulong)uVar5);
        bVar1 = isSingleWord(this);
        if ((!bVar1) &&
           (puVar6 = (this->super_SVIntStorage).field_0.pVal, puVar6 != (uint64_t *)0x0)) {
          operator_delete__(puVar6);
        }
        (this->super_SVIntStorage).unknownFlag = true;
        (this->super_SVIntStorage).field_0 = local_38;
      }
      puVar6 = getRawData(this);
      local_44[2] = 0;
      puVar7 = (uint32_t *)std::max<int>((int *)&value_local,local_44 + 2);
      uVar5 = *puVar7;
      puVar8 = getRawData(_frontOOB);
      bitcpy(puVar6,uVar5,puVar8,(uint32_t)newData,validSelectWidth);
      if (((_frontOOB->super_SVIntStorage).unknownFlag & 1U) == 0) {
        if (((this->super_SVIntStorage).unknownFlag & 1U) != 0) {
          puVar6 = getRawData(this);
          uVar5 = getNumWords((this->super_SVIntStorage).bitWidth,false);
          local_44[0] = 0;
          puVar7 = (uint32_t *)std::max<int>((int *)&value_local,local_44);
          clearBits(puVar6 + uVar5,*puVar7,(uint32_t)newData);
        }
      }
      else {
        puVar6 = getRawData(this);
        uVar3 = getNumWords((this->super_SVIntStorage).bitWidth,false);
        local_44[1] = 0;
        puVar7 = (uint32_t *)std::max<int>((int *)&value_local,local_44 + 1);
        uVar5 = *puVar7;
        puVar8 = getRawData(_frontOOB);
        uVar4 = getNumWords((_frontOOB->super_SVIntStorage).bitWidth,false);
        bitcpy(puVar6 + uVar3,uVar5,puVar8 + uVar4,(uint32_t)newData,validSelectWidth);
      }
      clearUnusedBits(this);
      checkUnknown(this);
    }
    return;
  }
  assert::assertFailed
            ("value.getBitWidth() == selectWidth",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/numeric/SVInt.cpp"
             ,0x5de,"void slang::SVInt::set(int32_t, int32_t, const SVInt &)");
}

Assistant:

void SVInt::set(int32_t msb, int32_t lsb, const SVInt& value) {
    ASSERT(msb >= lsb);

    bitwidth_t selectWidth = bitwidth_t(msb - lsb + 1);
    ASSERT(value.getBitWidth() == selectWidth);
    if (msb < 0 || lsb >= int32_t(bitWidth))
        return;

    uint32_t frontOOB = lsb < 0 ? uint32_t(-lsb) : 0;
    uint32_t backOOB = bitwidth_t(msb) >= bitWidth ? bitwidth_t(msb - int32_t(bitWidth) + 1) : 0;
    uint32_t validSelectWidth = selectWidth - frontOOB - backOOB;

    if (!hasUnknown() && value.hasUnknown()) {
        uint64_t* newData = new uint64_t[getNumWords(bitWidth, true)]();
        memcpy(newData, getRawData(), getNumWords());

        if (!isSingleWord())
            delete[] pVal;

        unknownFlag = true;
        pVal = newData;
    }

    bitcpy(getRawData(), (uint32_t)std::max(lsb, 0), value.getRawData(), validSelectWidth,
           frontOOB);
    if (value.unknownFlag) {
        bitcpy(getRawData() + getNumWords(bitWidth, false), (uint32_t)std::max(lsb, 0),
               value.getRawData() + getNumWords(value.bitWidth, false), validSelectWidth, frontOOB);
    }
    else if (unknownFlag) {
        // We have to unset any of the unknown bits for the given segment.
        clearBits(getRawData() + getNumWords(bitWidth, false), (uint32_t)std::max(lsb, 0),
                  validSelectWidth);
    }

    clearUnusedBits();
    checkUnknown();
}